

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O0

int Gia_Iso3Unique(Vec_Int_t *vSign)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vCopy;
  int nUnique;
  Vec_Int_t *vSign_local;
  
  p = Vec_IntDup(vSign);
  Vec_IntUniqify(p);
  iVar1 = Vec_IntSize(p);
  Vec_IntFree(p);
  return iVar1;
}

Assistant:

int Gia_Iso3Unique( Vec_Int_t * vSign )
{
    int nUnique;
    Vec_Int_t * vCopy = Vec_IntDup( vSign );
    Vec_IntUniqify( vCopy );
    nUnique = Vec_IntSize(vCopy);
    Vec_IntFree( vCopy );
    return nUnique;
}